

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O0

void parseUUID(char *uuid,uchar *buffer_out,uint out_size)

{
  int iVar1;
  size_t __size;
  size_t len;
  void *pvStack_30;
  uchar cur_character;
  char *hexuuid;
  uint local_20;
  uint j;
  uint i;
  uint out_size_local;
  uchar *buffer_out_local;
  char *uuid_local;
  
  j = out_size;
  _i = buffer_out;
  buffer_out_local = (uchar *)uuid;
  __size = strlen(uuid);
  pvStack_30 = malloc(__size);
  memset(_i,0,(ulong)j);
  memset(pvStack_30,0,__size);
  hexuuid._4_4_ = 0;
  for (local_20 = 0; local_20 < __size; local_20 = local_20 + 1) {
    iVar1 = isxdigit((int)(char)buffer_out_local[local_20]);
    if (iVar1 != 0) {
      *(uchar *)((long)pvStack_30 + (ulong)hexuuid._4_4_) = buffer_out_local[local_20];
      hexuuid._4_4_ = hexuuid._4_4_ + 1;
    }
  }
  if ((hexuuid._4_4_ & 1) == 1) {
    *(undefined1 *)((long)pvStack_30 + (ulong)hexuuid._4_4_) = 0x30;
    hexuuid._4_4_ = hexuuid._4_4_ + 1;
  }
  *(undefined1 *)((long)pvStack_30 + (ulong)hexuuid._4_4_) = 0;
  for (local_20 = 0; local_20 < hexuuid._4_4_ >> 1; local_20 = local_20 + 1) {
    __isoc99_sscanf((long)pvStack_30 + (ulong)(local_20 << 1),"%2hhx",(long)&len + 7);
    _i[(ulong)local_20 % (ulong)j] = _i[(ulong)local_20 % (ulong)j] ^ len._7_1_;
  }
  free(pvStack_30);
  return;
}

Assistant:

static void parseUUID(const char *uuid, unsigned char *buffer_out, unsigned int out_size) {
	unsigned int i, j;
	char *hexuuid;
	unsigned char cur_character;
	// remove characters not in hex set
	size_t len = strlen(uuid);
	hexuuid = (char *)malloc(sizeof(char) * len);
	memset(buffer_out, 0, out_size);
	memset(hexuuid, 0, sizeof(char) * len);

	for (i = 0, j = 0; i < len; i++) {
		if (isxdigit(uuid[i])) {
			hexuuid[j] = uuid[i];
			j++;
		} else {
			// skip
			continue;
		}
	}
	if (j % 2 == 1) {
		hexuuid[j++] = '0';
	}
	hexuuid[j] = '\0';
	for (i = 0; i < j / 2; i++) {
		sscanf(&hexuuid[i * 2], "%2hhx", &cur_character);
		buffer_out[i % out_size] = buffer_out[i % out_size] ^ cur_character;
	}

	free(hexuuid);
}